

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.h
# Opt level: O2

bool __thiscall Image::writeBmp(Image *this,char *fileName)

{
  int iVar1;
  FILE *__s;
  BmpHeader bmp;
  
  bmp.horzResolution = 0;
  bmp.vertResolution = 0;
  bmp.width = this->_width;
  bmp.headerSize = 0x28;
  iVar1 = this->_width * this->_height;
  bmp.planes = 1;
  bmp.bitsPerPixel = 0x20;
  bmp.height = -this->_height;
  bmp._32_8_ = (ulong)(uint)(iVar1 * 4) << 0x20;
  bmp.colorsUsed = 0;
  bmp.colorsImportant = 0;
  bmp.reserved = 0;
  bmp.imageOffset = 0x36;
  bmp.fileSize = iVar1 * 4 + 0x36;
  bmp.padding[0] = '\0';
  bmp.padding[1] = '\0';
  bmp.signature[0] = 'B';
  bmp.signature[1] = 'M';
  __s = fopen(fileName,"wb");
  if (__s != (FILE *)0x0) {
    fwrite(bmp.signature,0x36,1,__s);
    fwrite(this->_data,(long)this->_height * this->_stride,1,__s);
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

bool writeBmp(const char* fileName) const noexcept {
    BmpHeader bmp;
    bmp.init(_width, _height);

    std::FILE* f = std::fopen(fileName, "wb");
    if (!f)
      return false;

    std::fwrite(&bmp.signature, sizeof(BmpHeader) - 2, 1, f);
    std::fwrite(_data, _stride * _height, 1, f);
    std::fclose(f);
    return true;
  }